

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

bool pstore::command_line::details::
     parse_command_line_options<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream,std::__cxx11::ostringstream>
               (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first_arg,
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               last_arg,string *overview,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *outs,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  bool bVar1;
  reference path;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8 [2];
  _List_node_base *local_1e8;
  _List_node_base *local_1e0;
  tuple<std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  local_1d8;
  byte local_1c2;
  allocator local_1c1;
  undefined1 local_1c0 [6];
  bool ok;
  name local_1a0;
  string local_180;
  string local_150;
  undefined1 local_130 [8];
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_> help
  ;
  undefined1 local_58 [8];
  string program_name;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs_local;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *outs_local;
  string *overview_local;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_arg_local;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_arg_local;
  
  program_name.field_2._8_8_ = errs;
  last_arg_local = first_arg;
  help.outs_ = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&last_arg_local,0);
  path = std::
         _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&help.outs_);
  pstore::path::base_name((string *)local_58,path);
  std::__cxx11::string::string((string *)&local_150,(string *)local_58);
  std::__cxx11::string::string((string *)&local_180,(string *)overview);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1c0,"help",&local_1c1);
  command_line::name::name(&local_1a0,(string *)local_1c0);
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help<pstore::command_line::name>
            ((help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_130,&local_150,&local_180,outs,&local_1a0);
  command_line::name::~name(&local_1a0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_150);
  local_1c2 = 1;
  local_1e0 = last_arg_local._M_node;
  local_1e8 = last_arg._M_node;
  parse_option_arguments<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream>
            ((details *)&local_1d8,last_arg_local,last_arg,(string *)local_58,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             program_name.field_2._8_8_);
  std::tie<std::_List_iterator<std::__cxx11::string>,bool>(local_1f8,(bool *)&last_arg_local);
  std::tuple<std::_List_iterator<std::__cxx11::string>&,bool&>::operator=
            ((tuple<std::_List_iterator<std::__cxx11::string>&,bool&> *)local_1f8,&local_1d8);
  if ((local_1c2 & 1) == 0) {
    first_arg_local._M_node._7_1_ = false;
  }
  else {
    bVar1 = parse_positional_arguments<std::_List_iterator<std::__cxx11::string>>
                      (last_arg_local,last_arg);
    if (bVar1) {
      first_arg_local._M_node._7_1_ =
           check_for_missing<std::__cxx11::ostringstream>
                     ((string *)local_58,
                      (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      program_name.field_2._8_8_);
    }
    else {
      first_arg_local._M_node._7_1_ = false;
    }
  }
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~help((help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_130);
  std::__cxx11::string::~string((string *)local_58);
  return first_arg_local._M_node._7_1_;
}

Assistant:

bool parse_command_line_options (InputIterator first_arg, InputIterator last_arg,
                                             std::string const & overview, OutputStream & outs,
                                             ErrorStream & errs) {
                std::string const program_name = pstore::path::base_name (*(first_arg++));
                help<OutputStream> const help (program_name, overview, outs, name ("help"));

                bool ok = true;
                std::tie (first_arg, ok) =
                    parse_option_arguments (first_arg, last_arg, program_name, errs);
                if (!ok) {
                    return false;
                }
                if (!parse_positional_arguments (first_arg, last_arg)) {
                    return false;
                }
                return check_for_missing (program_name, errs);
            }